

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  unsigned_long uVar3;
  ostream *poVar4;
  exception *e;
  string local_770;
  allocator<char> local_749;
  string local_748;
  allocator<char> local_721;
  string local_720;
  allocator<char> local_6f9;
  string local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  allocator<char> local_6b1;
  string local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  allocator<char> local_669;
  string local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  allocator<char> local_621;
  string local_620;
  allocator<char> local_5f9;
  string local_5f8;
  allocator<char> local_5d1;
  string local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  allocator<char> local_589;
  string local_588;
  allocator<char> local_561;
  string local_560;
  string local_540;
  allocator<char> local_519;
  string local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  string local_4b8;
  allocator<char> local_491;
  string local_490;
  allocator<char> local_469;
  string local_468;
  allocator<char> local_441;
  string local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  string local_400;
  undefined1 local_3e0 [8];
  Hr hr;
  undefined1 local_238 [4];
  int pstatus;
  Parg pg;
  char **argv_local;
  int argc_local;
  
  pg.similar_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  OB::Parg::Parg((Parg *)local_238,argc,argv);
  iVar2 = program_options((Parg *)local_238);
  if (iVar2 < 1) {
    if (iVar2 < 0) {
      argv_local._4_4_ = 1;
    }
    else {
      OB::Hr::Hr((Hr *)local_3e0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"string",&local_441);
      OB::Parg::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_420,(Parg *)local_238,&local_440);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"\n",&local_469);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"",&local_491);
      OB::String::replace(&local_400,&local_420,&local_468,&local_490);
      OB::Hr::fill((Hr *)local_3e0,&local_400);
      std::__cxx11::string::~string((string *)&local_400);
      std::__cxx11::string::~string((string *)&local_490);
      std::allocator<char>::~allocator(&local_491);
      std::__cxx11::string::~string((string *)&local_468);
      std::allocator<char>::~allocator(&local_469);
      std::__cxx11::string::~string((string *)&local_420);
      std::__cxx11::string::~string((string *)&local_440);
      std::allocator<char>::~allocator(&local_441);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,"text",&local_519);
      OB::Parg::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_4f8,(Parg *)local_238,&local_518);
      OB::Parg::get_stdin_abi_cxx11_(&local_540,(Parg *)local_238);
      std::operator+(&local_4d8,&local_4f8,&local_540);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_560,"\n",&local_561);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_588,"",&local_589);
      OB::String::replace(&local_4b8,&local_4d8,&local_560,&local_588);
      OB::Hr::text((Hr *)local_3e0,&local_4b8);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::__cxx11::string::~string((string *)&local_588);
      std::allocator<char>::~allocator(&local_589);
      std::__cxx11::string::~string((string *)&local_560);
      std::allocator<char>::~allocator(&local_561);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::__cxx11::string::~string((string *)&local_540);
      std::__cxx11::string::~string((string *)&local_4f8);
      std::__cxx11::string::~string((string *)&local_518);
      std::allocator<char>::~allocator(&local_519);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d0,"align",&local_5d1);
      OB::Parg::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_5b0,(Parg *)local_238,&local_5d0);
      OB::Hr::align((Hr *)local_3e0,&local_5b0);
      std::__cxx11::string::~string((string *)&local_5b0);
      std::__cxx11::string::~string((string *)&local_5d0);
      std::allocator<char>::~allocator(&local_5d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f8,"bold",&local_5f9);
      bVar1 = OB::Parg::get<bool,_0>((Parg *)local_238,&local_5f8);
      OB::Hr::bold((Hr *)local_3e0,bVar1);
      std::__cxx11::string::~string((string *)&local_5f8);
      std::allocator<char>::~allocator(&local_5f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_620,"underline",&local_621);
      bVar1 = OB::Parg::get<bool,_0>((Parg *)local_238,&local_620);
      OB::Hr::underline((Hr *)local_3e0,bVar1);
      std::__cxx11::string::~string((string *)&local_620);
      std::allocator<char>::~allocator(&local_621);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_668,"colour",&local_669);
      OB::Parg::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_648,(Parg *)local_238,&local_668);
      OB::Hr::color((Hr *)local_3e0,&local_648);
      std::__cxx11::string::~string((string *)&local_648);
      std::__cxx11::string::~string((string *)&local_668);
      std::allocator<char>::~allocator(&local_669);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6b0,"colour-fg",&local_6b1);
      OB::Parg::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_690,(Parg *)local_238,&local_6b0);
      OB::Hr::color_fg((Hr *)local_3e0,&local_690);
      std::__cxx11::string::~string((string *)&local_690);
      std::__cxx11::string::~string((string *)&local_6b0);
      std::allocator<char>::~allocator(&local_6b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6f8,"colour-bg",&local_6f9);
      OB::Parg::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_6d8,(Parg *)local_238,&local_6f8);
      OB::Hr::color_bg((Hr *)local_3e0,&local_6d8);
      std::__cxx11::string::~string((string *)&local_6d8);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::allocator<char>::~allocator(&local_6f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_720,"columns",&local_721);
      uVar3 = OB::Parg::get<unsigned_long,_0>((Parg *)local_238,&local_720);
      OB::Hr::width((Hr *)local_3e0,uVar3);
      std::__cxx11::string::~string((string *)&local_720);
      std::allocator<char>::~allocator(&local_721);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_748,"rows",&local_749);
      uVar3 = OB::Parg::get<unsigned_long,_0>((Parg *)local_238,&local_748);
      OB::Hr::height((Hr *)local_3e0,uVar3);
      std::__cxx11::string::~string((string *)&local_748);
      std::allocator<char>::~allocator(&local_749);
      OB::Hr::render_abi_cxx11_(&local_770,(Hr *)local_3e0);
      std::__cxx11::string::~string((string *)&local_770);
      poVar4 = std::operator<<((ostream *)&std::cout,"\r");
      OB::Hr::str_abi_cxx11_((string *)&e,(Hr *)local_3e0);
      std::operator<<(poVar4,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      OB::Hr::~Hr((Hr *)local_3e0);
      argv_local._4_4_ = 0;
    }
  }
  else {
    argv_local._4_4_ = 0;
  }
  hr.buf_.field_2._8_4_ = 1;
  OB::Parg::~Parg((Parg *)local_238);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
  Parg pg {argc, argv};
  int pstatus {program_options(pg)};
  if (pstatus > 0) return 0;
  if (pstatus < 0) return 1;

  try
  {
    Hr hr;
    hr.fill(OB::String::replace(pg.get<std::string>("string"), "\n", ""));
    hr.text(OB::String::replace(pg.get<std::string>("text") + pg.get_stdin(), "\n", ""));
    hr.align(pg.get<std::string>("align"));
    hr.bold(pg.get<bool>("bold"));
    hr.underline(pg.get<bool>("underline"));
    hr.color(pg.get<std::string>("colour"));
    hr.color_fg(pg.get<std::string>("colour-fg"));
    hr.color_bg(pg.get<std::string>("colour-bg"));
    hr.width(pg.get<std::size_t>("columns"));
    hr.height(pg.get<std::size_t>("rows"));
    hr.render();

    std::cout << "\r" << hr.str();
  }
  catch (std::exception const& e)
  {
    std::cerr << "Error: " << e.what() << "\n";

    return 1;
  }

  return 0;
}